

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ReporterRegistry::registerReporter
          (ReporterRegistry *this,string *name,Ptr<Catch::IReporterFactory> *factory)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>
  local_48;
  Ptr<Catch::IReporterFactory> *local_20;
  Ptr<Catch::IReporterFactory> *factory_local;
  string *name_local;
  ReporterRegistry *this_local;
  
  local_20 = factory;
  factory_local = (Ptr<Catch::IReporterFactory> *)name;
  name_local = (string *)this;
  std::make_pair<std::__cxx11::string_const&,Catch::Ptr<Catch::IReporterFactory>const&>
            (&local_48,name,factory);
  std::
  map<std::__cxx11::string,Catch::Ptr<Catch::IReporterFactory>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::Ptr<Catch::IReporterFactory>>>>
  ::insert<std::pair<std::__cxx11::string,Catch::Ptr<Catch::IReporterFactory>>>
            ((map<std::__cxx11::string,Catch::Ptr<Catch::IReporterFactory>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::Ptr<Catch::IReporterFactory>>>>
              *)&this->m_factories,&local_48);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>
  ::~pair(&local_48);
  return;
}

Assistant:

void registerReporter( std::string const& name, Ptr<IReporterFactory> const& factory ) {
            m_factories.insert( std::make_pair( name, factory ) );
        }